

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::testTag_errorLevel_shouldPrintTag
               (string *message,string *timestampSeparator)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::SimpleLogger::setStream(Error,local_188);
  juzzlin::SimpleLogger::setLoggingLevel(Error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tag,"TAG",(allocator<char> *)&bStack_1f8);
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)&bStack_1f8,(string *)&tag);
  poVar1 = (ostream *)juzzlin::SimpleLogger::fatal_abi_cxx11_();
  std::operator<<(poVar1,(string *)message);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)&bStack_1f8);
  std::operator+(&local_1b8,&tag,": ");
  std::operator+(&bStack_1f8,&local_1b8,message);
  assertMessage(&ss,&bStack_1f8,timestampSeparator);
  std::__cxx11::string::~string((string *)&bStack_1f8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&tag);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void testTag_errorLevel_shouldPrintTag(const std::string & message, const std::string & timestampSeparator)
{
    std::stringstream ss;
    L::setStream(L::Level::Error, ss);
    L::setLoggingLevel(L::Level::Error);
    const std::string tag = "TAG";
    L(tag).fatal() << message;
    assertMessage(ss, tag + ": " + message, timestampSeparator);
}